

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrometracer.h
# Opt level: O3

void __thiscall CChromeTracer::addStartTimeMetadata(CChromeTracer *this,uint64_t startTime)

{
  int iVar1;
  ostream *poVar2;
  undefined8 uVar3;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&this->m_TraceFile,
               "{\"ph\":\"M\",\"name\":\"clintercept_start_time\",\"pid\":",0x30);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&this->m_TraceFile);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,",\"tid\":0",8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,",\"args\":{\"start_time\":",0x16);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}},\n",4);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  uVar3 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  _Unwind_Resume(uVar3);
}

Assistant:

void addStartTimeMetadata(
            uint64_t startTime )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);
        m_TraceFile
            << "{\"ph\":\"M\",\"name\":\"clintercept_start_time\",\"pid\":" << m_ProcessId
            << ",\"tid\":0"
            << ",\"args\":{\"start_time\":" << startTime
            << "}},\n";
    }